

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFaceOuterBound::~IfcFaceOuterBound(IfcFaceOuterBound *this,void **vtt)

{
  void **vtt_local;
  IfcFaceOuterBound *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceOuterBound,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceOuterBound,_0UL> *)
             &(this->super_IfcFaceBound).field_0x58,vtt + 0x10);
  IfcFaceBound::~IfcFaceBound(&this->super_IfcFaceBound,vtt + 1);
  return;
}

Assistant:

IfcFaceOuterBound() : Object("IfcFaceOuterBound") {}